

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmax_distance.cpp
# Opt level: O3

double __thiscall
ProbabEstimator::getProbab(ProbabEstimator *this,double *vecMaxs,int numReplaced,int pathLength)

{
  int iVar1;
  double dVar2;
  double dVar3;
  
  iVar1 = this->numMaxs;
  if (numReplaced == 0) {
    dVar2 = getProbabGt(this,vecMaxs[(long)iVar1 + -1],0,pathLength);
  }
  else if (iVar1 == numReplaced) {
    dVar2 = getProbabLt(this,*vecMaxs,numReplaced,pathLength);
  }
  else {
    dVar3 = getProbabLt(this,vecMaxs[(long)iVar1 - (long)numReplaced],numReplaced,pathLength);
    dVar2 = getProbabGt(this,vecMaxs[~numReplaced + this->numMaxs],numReplaced,pathLength);
    dVar2 = dVar2 + dVar3;
  }
  return 1.0 - dVar2;
}

Assistant:

double ProbabEstimator::getProbab( const double *vecMaxs, const int numReplaced, const int pathLength ){
    if ( numReplaced == 0 ) return 1.0 - getProbabGt( vecMaxs[numMaxs-1], 0, pathLength );
    if ( numReplaced == numMaxs ) return 1.0 - getProbabLt( vecMaxs[0], numMaxs, pathLength );
    return 1.0 - getProbabLt( vecMaxs[numMaxs-numReplaced], numReplaced, pathLength ) 
               - getProbabGt( vecMaxs[numMaxs-numReplaced-1], numReplaced, pathLength );
}